

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Induction.cpp
# Opt level: O2

void __thiscall
Inferences::InductionClauseIterator::performStructInductionFreeVar
          (InductionClauseIterator *this,InductionContext *context,Entry *e,
          Substitution *freeVarSubst)

{
  uint uVar1;
  pointer ppTVar2;
  Signature *this_00;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  TermList TVar6;
  TermAlgebra *this_01;
  TermAlgebraConstructor *this_02;
  TermList TVar7;
  Formula *pFVar8;
  Formula *pFVar9;
  Formula *pFVar10;
  List<unsigned_int> *pLVar11;
  Term *pTVar12;
  socklen_t __len;
  uint ith;
  __node_base *p_Var13;
  TermList elem;
  initializer_list<Kernel::TermList> __l;
  initializer_list<Kernel::TermList> __l_00;
  initializer_list<Kernel::TermList> __l_01;
  allocator_type local_105;
  uint local_104;
  List<unsigned_int> *local_100;
  TermList x;
  List<unsigned_int> *local_e8;
  List<Kernel::Formula_*> *local_e0;
  List<unsigned_int> *local_d8;
  List<Kernel::Formula_*> *local_c8;
  Substitution subst;
  ClauseStack hyp_clauses;
  DHMap<unsigned_int,_Kernel::Term_*,_Lib::DefaultHash,_Lib::DefaultHash2> bindings;
  
  this_00 = DAT_00a14190;
  ppTVar2 = (context->_indTerms).super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (8 < (ulong)((long)(context->_indTerms).
                        super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)ppTVar2)) {
    return;
  }
  TVar6 = Kernel::SortHelper::getResultSort(*ppTVar2);
  this_01 = Kernel::Signature::getTermAlgebraOfSort(this_00,TVar6);
  uVar3 = InductionContext::getFreeVariable(context);
  p_Var13 = &(context->_cls)._M_h._M_before_begin;
  local_104 = uVar3;
  do {
    uVar3 = uVar3 + 1;
    do {
      p_Var13 = p_Var13->_M_nxt;
      if (p_Var13 == (__node_base *)0x0) {
        local_e0 = (List<Kernel::Formula_*> *)0x0;
        local_e8 = (List<unsigned_int> *)0x0;
        local_100 = (List<unsigned_int> *)0x0;
        local_d8 = (List<unsigned_int> *)0x0;
        for (uVar4 = 0; uVar4 < this_01->_n; uVar4 = uVar4 + 1) {
          this_02 = Shell::TermAlgebra::constructor(this_01,uVar4);
          uVar5 = Shell::TermAlgebraConstructor::arity(this_02);
          Lib::Stack<Kernel::TermList>::Stack((Stack<Kernel::TermList> *)&subst,(ulong)uVar5);
          local_c8 = (List<Kernel::Formula_*> *)0x0;
          for (ith = 0; uVar5 != ith; ith = ith + 1) {
            elem._content._4_4_ = 0;
            elem._content._0_4_ = uVar3 * 4 + 1;
            Lib::Stack<Kernel::TermList>::push((Stack<Kernel::TermList> *)&subst,elem);
            local_e8 = Lib::List<unsigned_int>::cons(uVar3 & 0x3fffffff,local_e8);
            TVar6 = Shell::TermAlgebraConstructor::argSort(this_02,ith);
            TVar7 = Shell::TermAlgebraConstructor::rangeSort(this_02);
            uVar1 = uVar3 + 1;
            if (TVar6._content == TVar7._content) {
              hyp_clauses._capacity = (size_t)(uVar1 * 4 + 1);
              local_100 = Lib::List<unsigned_int>::cons(uVar1 & 0x3fffffff,local_100);
              __l._M_len = 1;
              __l._M_array = &x;
              x._content = elem._content;
              std::vector<Kernel::TermList,_std::allocator<Kernel::TermList>_>::vector
                        ((vector<Kernel::TermList,_std::allocator<Kernel::TermList>_> *)&bindings,
                         __l,&local_105);
              pFVar8 = InductionContext::getFormulaWithFreeVar
                                 (context,(vector<Kernel::TermList,_std::allocator<Kernel::TermList>_>
                                           *)&bindings,true,local_104,(TermList *)&hyp_clauses,
                                  (Substitution *)0x0);
              std::_Vector_base<Kernel::TermList,_std::allocator<Kernel::TermList>_>::~_Vector_base
                        ((_Vector_base<Kernel::TermList,_std::allocator<Kernel::TermList>_> *)
                         &bindings);
              local_c8 = Lib::List<Kernel::Formula_*>::cons(pFVar8,local_c8);
              uVar1 = uVar3 + 2;
            }
            uVar3 = uVar1;
          }
          hyp_clauses._capacity = (size_t)(uVar3 * 4 + 1);
          local_d8 = Lib::List<unsigned_int>::cons(uVar3 & 0x3fffffff,local_d8);
          x._content = (uint64_t)
                       Kernel::Term::create
                                 (this_02->_functor,
                                  (uint)((ulong)(CONCAT44(subst._map._nextExpansionOccupancy,
                                                          subst._map._capacity) -
                                                (long)CONCAT44(subst._map._capacityIndex,
                                                               subst._map._deleted)) >> 3),
                                  (TermList *)
                                  CONCAT44(subst._map._capacityIndex,subst._map._deleted));
          __l_00._M_len = 1;
          __l_00._M_array = &x;
          std::vector<Kernel::TermList,_std::allocator<Kernel::TermList>_>::vector
                    ((vector<Kernel::TermList,_std::allocator<Kernel::TermList>_> *)&bindings,__l_00
                     ,&local_105);
          pFVar8 = InductionContext::getFormulaWithFreeVar
                             (context,(vector<Kernel::TermList,_std::allocator<Kernel::TermList>_> *
                                      )&bindings,true,local_104,(TermList *)&hyp_clauses,
                              (Substitution *)0x0);
          std::_Vector_base<Kernel::TermList,_std::allocator<Kernel::TermList>_>::~_Vector_base
                    ((_Vector_base<Kernel::TermList,_std::allocator<Kernel::TermList>_> *)&bindings)
          ;
          if (local_100 != (List<unsigned_int> *)0x0) {
            pFVar9 = (Formula *)Kernel::BinaryFormula::operator_new(0x38);
            pFVar10 = Kernel::JunctionFormula::generalJunction(AND,local_c8);
            Kernel::Formula::Formula(pFVar9,IMP);
            *(Formula **)(pFVar9 + 1) = pFVar10;
            pFVar9[1]._label._M_dataplus._M_p = (pointer)pFVar8;
            pFVar8 = pFVar9;
          }
          local_e0 = Lib::List<Kernel::Formula_*>::cons(pFVar8,local_e0);
          uVar3 = uVar3 + 1;
          Lib::Stack<Kernel::TermList>::~Stack((Stack<Kernel::TermList> *)&subst);
        }
        pFVar8 = (Formula *)Kernel::JunctionFormula::operator_new(0x30);
        Kernel::Formula::Formula(pFVar8,AND);
        *(List<Kernel::Formula_*> **)(pFVar8 + 1) = local_e0;
        hyp_clauses._capacity = (size_t)(uVar3 * 4 + 1);
        x._content = (uint64_t)(uVar3 * 4 + 5);
        subst._map._timestamp = 1;
        subst._map._afterLast._4_4_ = 0;
        subst._map._size = 0;
        subst._map._deleted = 0;
        subst._map._capacityIndex = 0;
        subst._map._capacity = 0;
        subst._map._nextExpansionOccupancy = 0;
        subst._map._entries._0_4_ = 0;
        subst._map._28_8_ = 0;
        __l_01._M_len = 1;
        __l_01._M_array = (iterator)&hyp_clauses;
        std::vector<Kernel::TermList,_std::allocator<Kernel::TermList>_>::vector
                  ((vector<Kernel::TermList,_std::allocator<Kernel::TermList>_> *)&bindings,__l_01,
                   &local_105);
        pFVar9 = InductionContext::getFormulaWithFreeVar
                           (context,(vector<Kernel::TermList,_std::allocator<Kernel::TermList>_> *)
                                    &bindings,true,local_104,&x,&subst);
        std::_Vector_base<Kernel::TermList,_std::allocator<Kernel::TermList>_>::~_Vector_base
                  ((_Vector_base<Kernel::TermList,_std::allocator<Kernel::TermList>_> *)&bindings);
        pFVar10 = (Formula *)Kernel::BinaryFormula::operator_new(0x38);
        Kernel::Formula::Formula(pFVar10,IMP);
        *(Formula **)(pFVar10 + 1) = pFVar8;
        pFVar10[1]._label._M_dataplus._M_p = (pointer)pFVar9;
        pFVar8 = (Formula *)Kernel::QuantifiedFormula::operator_new(0x40);
        pLVar11 = Lib::List<unsigned_int>::singleton(uVar3 + 1);
        Kernel::Formula::Formula(pFVar8,EXISTS);
        *(List<unsigned_int> **)(pFVar8 + 1) = pLVar11;
        pFVar8[1]._label._M_dataplus._M_p = (pointer)0x0;
        pFVar8[1]._label._M_string_length = (size_type)pFVar10;
        pFVar9 = (Formula *)Kernel::QuantifiedFormula::operator_new(0x40);
        pLVar11 = Lib::List<unsigned_int>::singleton(uVar3 & 0x3fffffff);
        Kernel::Formula::Formula(pFVar9,FORALL);
        *(List<unsigned_int> **)(pFVar9 + 1) = pLVar11;
        pFVar9[1]._label._M_dataplus._M_p = (pointer)0x0;
        pFVar9[1]._label._M_string_length = (size_type)pFVar8;
        pFVar8 = (Formula *)Kernel::QuantifiedFormula::operator_new(0x40);
        Kernel::Formula::Formula(pFVar8,FORALL);
        *(List<unsigned_int> **)(pFVar8 + 1) = local_d8;
        pFVar8[1]._label._M_dataplus._M_p = (pointer)0x0;
        pFVar8[1]._label._M_string_length = (size_type)pFVar9;
        if (local_100 != (List<unsigned_int> *)0x0) {
          pFVar9 = (Formula *)Kernel::QuantifiedFormula::operator_new(0x40);
          Kernel::Formula::Formula(pFVar9,EXISTS);
          *(List<unsigned_int> **)(pFVar9 + 1) = local_100;
          pFVar9[1]._label._M_dataplus._M_p = (pointer)0x0;
          pFVar9[1]._label._M_string_length = (size_type)pFVar8;
          pFVar8 = pFVar9;
        }
        if (local_e8 != (List<unsigned_int> *)0x0) {
          pFVar9 = (Formula *)Kernel::QuantifiedFormula::operator_new(0x40);
          Kernel::Formula::Formula(pFVar9,EXISTS);
          *(List<unsigned_int> **)(pFVar9 + 1) = local_e8;
          pFVar9[1]._label._M_dataplus._M_p = (pointer)0x0;
          pFVar9[1]._label._M_string_length = (size_type)pFVar8;
          pFVar8 = pFVar9;
        }
        bindings._timestamp = 1;
        bindings._size = 0;
        bindings._deleted = 0;
        bindings._capacityIndex = 0;
        bindings._capacity = 0;
        bindings._20_8_ = 0;
        bindings._28_8_ = 0;
        bindings._afterLast._4_4_ = 0;
        __len = 0x94;
        produceClauses(&hyp_clauses,this,pFVar8,STRUCT_INDUCTION_AXIOM_ONE,context,&bindings);
        pTVar12 = Lib::DHMap<unsigned_int,_Kernel::Term_*,_Lib::DefaultHash,_Lib::DefaultHash2>::get
                            (&bindings,uVar3 + 1,(Term *)0x0);
        pTVar12 = Kernel::SubstHelper::applyImpl<false,Kernel::Substitution>(pTVar12,&subst,false);
        Kernel::Substitution::bind(freeVarSubst,local_104,(sockaddr *)pTVar12,__len);
        Indexing::InductionFormulaIndex::Entry::add(e,&hyp_clauses,&subst);
        Lib::Stack<Kernel::Clause_*>::~Stack(&hyp_clauses);
        Lib::DHMap<unsigned_int,_Kernel::Term_*,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
                  (&bindings);
        Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
                  (&subst._map);
        return;
      }
      uVar4 = Kernel::Clause::maxVar((Clause *)p_Var13[1]._M_nxt);
    } while (uVar4 + 1 <= uVar3);
    uVar3 = Kernel::Clause::maxVar((Clause *)p_Var13[1]._M_nxt);
  } while( true );
}

Assistant:

void InductionClauseIterator::performStructInductionFreeVar(const InductionContext& context, InductionFormulaIndex::Entry* e, Substitution* freeVarSubst)
{
  if (context._indTerms.size() > 1) return;
  TermAlgebra* ta = env.signature->getTermAlgebraOfSort(SortHelper::getResultSort(context._indTerms[0]));
  unsigned freeVar = context.getFreeVariable(); // variable free in the induction literal
  unsigned var = freeVar+1; // used in the following to construct new variables
  for (const auto& kv : context._cls) {
    if (kv.first->maxVar() + 1 > var) {
      var = kv.first->maxVar() + 1;
    }
  }
  VList* us = VList::empty();
  VList* ws = VList::empty();
  VList* ys = VList::empty();
  FormulaList* formulas = FormulaList::empty();

  // Construct premise as a conjunction of steps.
  // Each step's antecedent contains a fresh free variable in place
  // of freeVar (collected in `ws`), each step's conclusion too (collected in `us`).
  for (unsigned i = 0; i < ta->nConstructors(); i++){
    TermAlgebraConstructor* con = ta->constructor(i);
    unsigned arity = con->arity();
    TermStack argTerms(arity); // Arguments of the step case antecedent: y_1, ..., y_arity
    FormulaList* hyps = FormulaList::empty();
    for (unsigned j = 0; j < arity; j++){
      TermList y(var++, false);
      argTerms.push(y);
      VList::push(y.var(), ys);
      if (con->argSort(j) == con->rangeSort()){
        TermList w(var++, false);
        VList::push(w.var(), ws);
        Formula* curLit = context.getFormulaWithFreeVar({ y }, true, freeVar, w);
        FormulaList::push(curLit, hyps); // L[y_j, w_j]
      }
    }
    TermList u(var++, false);
    VList::push(u.var(), us);
    Term* tcons = Term::create(con->functor(), (unsigned)argTerms.size(), argTerms.begin());
    Formula* consequent = context.getFormulaWithFreeVar({ TermList(tcons) }, true, freeVar, u);
    Formula* step = (VList::isEmpty(ws)) ? consequent :
      new BinaryFormula(Connective::IMP, JunctionFormula::generalJunction(Connective::AND, hyps), consequent); // (/\_{j ∈ P_c} L[y_j, w_j]) --> L[cons(y_1, ..., y_n), u_i]
    formulas->push(step, formulas);
  }
  Formula* formula = new JunctionFormula(Connective::AND, formulas);

  // Construct conclusion: L[z, x]
  TermList z(var++, false);
  const unsigned xvar = var;
  TermList x(var++, false);
  Substitution subst;
  Formula* conclusion = context.getFormulaWithFreeVar({ z }, true, freeVar, x, &subst);
  // Put together the whole induction axiom:
  formula = new BinaryFormula(Connective::IMP, formula, conclusion);
  formula = new QuantifiedFormula(Connective::EXISTS, VList::singleton(xvar), SList::empty(), formula);
  formula = new QuantifiedFormula(Connective::FORALL, VList::singleton(z.var()), SList::empty(), formula);
  formula = new QuantifiedFormula(Connective::FORALL, us, SList::empty(), formula);
  if (!VList::isEmpty(ws)) {
    formula = new QuantifiedFormula(Connective::EXISTS, ws, SList::empty(), formula);
  }
  if (!VList::isEmpty(ys)) {
    formula = new QuantifiedFormula(Connective::EXISTS, ys, SList::empty(), formula);
  }

  // Produce induction clauses and obtain the skolemization bindings.
  DHMap<unsigned, Term*> bindings;
  ClauseStack hyp_clauses = produceClauses(formula, InferenceRule::STRUCT_INDUCTION_AXIOM_ONE, context, &bindings); 
  // Bind freeVar to its corresponding skolem term in freeVarSubst.
  // This is used later in resolution.
  Term* xSkolem = bindings.get(xvar, nullptr);
  ASS(xSkolem != nullptr);
  ASS(freeVarSubst != nullptr);
  freeVarSubst->bind(int(freeVar), SubstHelper::apply<Substitution>(xSkolem, subst));

  e->add(std::move(hyp_clauses), std::move(subst));
  return;
}